

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-matchers.h
# Opt level: O3

void __thiscall
testing::internal::
ComparisonBase<testing::internal::EqMatcher<prometheus::ClientMetric::Label>,_prometheus::ClientMetric::Label,_testing::internal::AnyEq>
::~ComparisonBase(ComparisonBase<testing::internal::EqMatcher<prometheus::ClientMetric::Label>,_prometheus::ClientMetric::Label,_testing::internal::AnyEq>
                  *this)

{
  pointer pcVar1;
  
  pcVar1 = (this->rhs_).value._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->rhs_).value.field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->rhs_).name._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->rhs_).name.field_2) {
    operator_delete(pcVar1);
    return;
  }
  return;
}

Assistant:

explicit ComparisonBase(const Rhs& rhs) : rhs_(rhs) {}